

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O3

void xPredIntraAngAdi_X(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  char cVar1;
  byte bVar2;
  pel pVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  pel *ppVar40;
  int iVar41;
  uint uVar42;
  undefined1 in_XMM0 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar65;
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  int iVar79;
  int iVar83;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int imult;
  
  auVar31 = _DAT_00183b30;
  auVar30 = _DAT_00183b20;
  auVar29 = _DAT_00163a40;
  auVar28 = _DAT_00163a30;
  auVar27 = _DAT_00163a20;
  auVar26 = _DAT_00163a10;
  auVar25 = _DAT_00163a00;
  if (0 < height) {
    cVar1 = tab_auc_dir_dxdy[0][mode][0];
    bVar2 = tab_auc_dir_dxdy[0][mode][1];
    uVar34 = (ulong)(width * 2);
    ppVar40 = dst + 0xf;
    iVar41 = 0;
    do {
      iVar41 = iVar41 + 1;
      iVar36 = iVar41 * cVar1;
      iVar32 = iVar36 >> (bVar2 & 0x1f);
      iVar36 = (iVar36 * 0x20 >> (bVar2 & 0x1f)) + iVar32 * -0x20;
      iVar38 = width * 2 - iVar32;
      uVar37 = (ulong)(iVar38 + 1);
      if (width <= iVar38) {
        uVar37 = (ulong)(uint)width;
      }
      uVar42 = (uint)uVar37;
      if ((int)uVar42 < 1) {
        *dst = (pel)(iVar36 * (uint)src[uVar34 + 3] +
                     (iVar36 + 0x20) * (uint)src[uVar34 + 2] +
                     (0x40 - iVar36) * (uint)src[uVar34 | 1] + (0x20 - iVar36) * (uint)src[uVar34] +
                     0x40 >> 7);
        uVar42 = 0;
        uVar33 = 0;
      }
      else {
        lVar35 = (long)iVar32;
        uVar39 = 0;
        do {
          dst[uVar39] = (pel)((uint)src[uVar39 + lVar35 + 2] * (iVar36 + 0x20) +
                              (uint)src[uVar39 + lVar35 + 1] * (0x40 - iVar36) +
                              (uint)src[uVar39 + lVar35] * (0x20 - iVar36) +
                              (uint)src[uVar39 + lVar35 + 3] * iVar36 + 0x40 >> 7);
          uVar39 = uVar39 + 1;
        } while (uVar37 != uVar39);
        uVar33 = uVar42 - 1;
      }
      if ((int)uVar42 < width) {
        uVar37 = (ulong)uVar42;
        pVar3 = dst[uVar33];
        lVar35 = ((uint)width - uVar37) + -1;
        auVar60._8_4_ = (int)lVar35;
        auVar60._0_8_ = lVar35;
        auVar60._12_4_ = (int)((ulong)lVar35 >> 0x20);
        uVar39 = 0;
        do {
          auVar61._8_4_ = (int)uVar39;
          auVar61._0_8_ = uVar39;
          auVar61._12_4_ = (int)(uVar39 >> 0x20);
          auVar63 = auVar60 ^ auVar29;
          auVar66 = (auVar61 | auVar28) ^ auVar29;
          iVar32 = auVar63._0_4_;
          iVar79 = -(uint)(iVar32 < auVar66._0_4_);
          iVar36 = auVar63._4_4_;
          auVar68._4_4_ = -(uint)(iVar36 < auVar66._4_4_);
          iVar38 = auVar63._8_4_;
          iVar83 = -(uint)(iVar38 < auVar66._8_4_);
          iVar65 = auVar63._12_4_;
          auVar68._12_4_ = -(uint)(iVar65 < auVar66._12_4_);
          auVar43._4_4_ = iVar79;
          auVar43._0_4_ = iVar79;
          auVar43._8_4_ = iVar83;
          auVar43._12_4_ = iVar83;
          auVar43 = pshuflw(in_XMM0,auVar43,0xe8);
          auVar67._4_4_ = -(uint)(auVar66._4_4_ == iVar36);
          auVar67._12_4_ = -(uint)(auVar66._12_4_ == iVar65);
          auVar67._0_4_ = auVar67._4_4_;
          auVar67._8_4_ = auVar67._12_4_;
          auVar52 = pshuflw(in_XMM1,auVar67,0xe8);
          auVar68._0_4_ = auVar68._4_4_;
          auVar68._8_4_ = auVar68._12_4_;
          auVar66 = pshuflw(auVar43,auVar68,0xe8);
          auVar63._8_4_ = 0xffffffff;
          auVar63._0_8_ = 0xffffffffffffffff;
          auVar63._12_4_ = 0xffffffff;
          auVar63 = (auVar66 | auVar52 & auVar43) ^ auVar63;
          auVar63 = packssdw(auVar63,auVar63);
          if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            ppVar40[uVar39 + (uVar37 - 0xf)] = pVar3;
          }
          auVar52._4_4_ = iVar79;
          auVar52._0_4_ = iVar79;
          auVar52._8_4_ = iVar83;
          auVar52._12_4_ = iVar83;
          auVar68 = auVar67 & auVar52 | auVar68;
          auVar63 = packssdw(auVar68,auVar68);
          auVar66._8_4_ = 0xffffffff;
          auVar66._0_8_ = 0xffffffffffffffff;
          auVar66._12_4_ = 0xffffffff;
          auVar63 = packssdw(auVar63 ^ auVar66,auVar63 ^ auVar66);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63._0_4_ >> 8 & 1) != 0) {
            ppVar40[uVar39 + (uVar37 - 0xe)] = pVar3;
          }
          auVar63 = (auVar61 | auVar27) ^ auVar29;
          auVar53._0_4_ = -(uint)(iVar32 < auVar63._0_4_);
          auVar53._4_4_ = -(uint)(iVar36 < auVar63._4_4_);
          auVar53._8_4_ = -(uint)(iVar38 < auVar63._8_4_);
          auVar53._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
          auVar69._4_4_ = auVar53._0_4_;
          auVar69._0_4_ = auVar53._0_4_;
          auVar69._8_4_ = auVar53._8_4_;
          auVar69._12_4_ = auVar53._8_4_;
          iVar79 = -(uint)(auVar63._4_4_ == iVar36);
          iVar83 = -(uint)(auVar63._12_4_ == iVar65);
          auVar13._4_4_ = iVar79;
          auVar13._0_4_ = iVar79;
          auVar13._8_4_ = iVar83;
          auVar13._12_4_ = iVar83;
          auVar80._4_4_ = auVar53._4_4_;
          auVar80._0_4_ = auVar53._4_4_;
          auVar80._8_4_ = auVar53._12_4_;
          auVar80._12_4_ = auVar53._12_4_;
          auVar63 = auVar13 & auVar69 | auVar80;
          auVar63 = packssdw(auVar63,auVar63);
          auVar4._8_4_ = 0xffffffff;
          auVar4._0_8_ = 0xffffffffffffffff;
          auVar4._12_4_ = 0xffffffff;
          auVar63 = packssdw(auVar63 ^ auVar4,auVar63 ^ auVar4);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63._0_4_ >> 0x10 & 1) != 0) {
            ppVar40[uVar39 + (uVar37 - 0xd)] = pVar3;
          }
          auVar63 = pshufhw(auVar63,auVar69,0x84);
          auVar14._4_4_ = iVar79;
          auVar14._0_4_ = iVar79;
          auVar14._8_4_ = iVar83;
          auVar14._12_4_ = iVar83;
          auVar66 = pshufhw(auVar53,auVar14,0x84);
          auVar43 = pshufhw(auVar63,auVar80,0x84);
          auVar44._8_4_ = 0xffffffff;
          auVar44._0_8_ = 0xffffffffffffffff;
          auVar44._12_4_ = 0xffffffff;
          auVar44 = (auVar43 | auVar66 & auVar63) ^ auVar44;
          auVar63 = packssdw(auVar44,auVar44);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63._0_4_ >> 0x18 & 1) != 0) {
            ppVar40[uVar39 + (uVar37 - 0xc)] = pVar3;
          }
          auVar63 = (auVar61 | auVar26) ^ auVar29;
          auVar54._0_4_ = -(uint)(iVar32 < auVar63._0_4_);
          auVar54._4_4_ = -(uint)(iVar36 < auVar63._4_4_);
          auVar54._8_4_ = -(uint)(iVar38 < auVar63._8_4_);
          auVar54._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
          auVar15._4_4_ = auVar54._0_4_;
          auVar15._0_4_ = auVar54._0_4_;
          auVar15._8_4_ = auVar54._8_4_;
          auVar15._12_4_ = auVar54._8_4_;
          auVar66 = pshuflw(auVar80,auVar15,0xe8);
          auVar45._0_4_ = -(uint)(auVar63._0_4_ == iVar32);
          auVar45._4_4_ = -(uint)(auVar63._4_4_ == iVar36);
          auVar45._8_4_ = -(uint)(auVar63._8_4_ == iVar38);
          auVar45._12_4_ = -(uint)(auVar63._12_4_ == iVar65);
          auVar70._4_4_ = auVar45._4_4_;
          auVar70._0_4_ = auVar45._4_4_;
          auVar70._8_4_ = auVar45._12_4_;
          auVar70._12_4_ = auVar45._12_4_;
          auVar63 = pshuflw(auVar45,auVar70,0xe8);
          auVar71._4_4_ = auVar54._4_4_;
          auVar71._0_4_ = auVar54._4_4_;
          auVar71._8_4_ = auVar54._12_4_;
          auVar71._12_4_ = auVar54._12_4_;
          auVar43 = pshuflw(auVar54,auVar71,0xe8);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar63 = packssdw(auVar63 & auVar66,(auVar43 | auVar63 & auVar66) ^ auVar5);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            ppVar40[uVar39 + (uVar37 - 0xb)] = pVar3;
          }
          auVar16._4_4_ = auVar54._0_4_;
          auVar16._0_4_ = auVar54._0_4_;
          auVar16._8_4_ = auVar54._8_4_;
          auVar16._12_4_ = auVar54._8_4_;
          auVar71 = auVar70 & auVar16 | auVar71;
          auVar43 = packssdw(auVar71,auVar71);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar63 = packssdw(auVar63,auVar43 ^ auVar6);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63._4_2_ >> 8 & 1) != 0) {
            ppVar40[uVar39 + (uVar37 - 10)] = pVar3;
          }
          auVar63 = (auVar61 | auVar25) ^ auVar29;
          auVar55._0_4_ = -(uint)(iVar32 < auVar63._0_4_);
          auVar55._4_4_ = -(uint)(iVar36 < auVar63._4_4_);
          auVar55._8_4_ = -(uint)(iVar38 < auVar63._8_4_);
          auVar55._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
          auVar72._4_4_ = auVar55._0_4_;
          auVar72._0_4_ = auVar55._0_4_;
          auVar72._8_4_ = auVar55._8_4_;
          auVar72._12_4_ = auVar55._8_4_;
          iVar79 = -(uint)(auVar63._4_4_ == iVar36);
          iVar83 = -(uint)(auVar63._12_4_ == iVar65);
          auVar17._4_4_ = iVar79;
          auVar17._0_4_ = iVar79;
          auVar17._8_4_ = iVar83;
          auVar17._12_4_ = iVar83;
          auVar81._4_4_ = auVar55._4_4_;
          auVar81._0_4_ = auVar55._4_4_;
          auVar81._8_4_ = auVar55._12_4_;
          auVar81._12_4_ = auVar55._12_4_;
          auVar63 = auVar17 & auVar72 | auVar81;
          auVar63 = packssdw(auVar63,auVar63);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar63 = packssdw(auVar63 ^ auVar7,auVar63 ^ auVar7);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            ppVar40[uVar39 + (uVar37 - 9)] = pVar3;
          }
          auVar63 = pshufhw(auVar63,auVar72,0x84);
          auVar18._4_4_ = iVar79;
          auVar18._0_4_ = iVar79;
          auVar18._8_4_ = iVar83;
          auVar18._12_4_ = iVar83;
          auVar66 = pshufhw(auVar55,auVar18,0x84);
          auVar43 = pshufhw(auVar63,auVar81,0x84);
          auVar46._8_4_ = 0xffffffff;
          auVar46._0_8_ = 0xffffffffffffffff;
          auVar46._12_4_ = 0xffffffff;
          auVar46 = (auVar43 | auVar66 & auVar63) ^ auVar46;
          auVar63 = packssdw(auVar46,auVar46);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63._6_2_ >> 8 & 1) != 0) {
            ppVar40[uVar39 + (uVar37 - 8)] = pVar3;
          }
          auVar63 = (auVar61 | auVar31) ^ auVar29;
          auVar56._0_4_ = -(uint)(iVar32 < auVar63._0_4_);
          auVar56._4_4_ = -(uint)(iVar36 < auVar63._4_4_);
          auVar56._8_4_ = -(uint)(iVar38 < auVar63._8_4_);
          auVar56._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
          auVar19._4_4_ = auVar56._0_4_;
          auVar19._0_4_ = auVar56._0_4_;
          auVar19._8_4_ = auVar56._8_4_;
          auVar19._12_4_ = auVar56._8_4_;
          auVar66 = pshuflw(auVar81,auVar19,0xe8);
          auVar47._0_4_ = -(uint)(auVar63._0_4_ == iVar32);
          auVar47._4_4_ = -(uint)(auVar63._4_4_ == iVar36);
          auVar47._8_4_ = -(uint)(auVar63._8_4_ == iVar38);
          auVar47._12_4_ = -(uint)(auVar63._12_4_ == iVar65);
          auVar73._4_4_ = auVar47._4_4_;
          auVar73._0_4_ = auVar47._4_4_;
          auVar73._8_4_ = auVar47._12_4_;
          auVar73._12_4_ = auVar47._12_4_;
          auVar63 = pshuflw(auVar47,auVar73,0xe8);
          auVar74._4_4_ = auVar56._4_4_;
          auVar74._0_4_ = auVar56._4_4_;
          auVar74._8_4_ = auVar56._12_4_;
          auVar74._12_4_ = auVar56._12_4_;
          auVar43 = pshuflw(auVar56,auVar74,0xe8);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar57 = (auVar43 | auVar63 & auVar66) ^ auVar57;
          auVar43 = packssdw(auVar57,auVar57);
          auVar63 = packsswb(auVar63 & auVar66,auVar43);
          if ((auVar63 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            ppVar40[uVar39 + (uVar37 - 7)] = pVar3;
          }
          auVar20._4_4_ = auVar56._0_4_;
          auVar20._0_4_ = auVar56._0_4_;
          auVar20._8_4_ = auVar56._8_4_;
          auVar20._12_4_ = auVar56._8_4_;
          auVar74 = auVar73 & auVar20 | auVar74;
          auVar43 = packssdw(auVar74,auVar74);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar43 = packssdw(auVar43 ^ auVar8,auVar43 ^ auVar8);
          auVar63 = packsswb(auVar63,auVar43);
          if ((auVar63._8_2_ >> 8 & 1) != 0) {
            ppVar40[uVar39 + (uVar37 - 6)] = pVar3;
          }
          auVar63 = (auVar61 | auVar30) ^ auVar29;
          auVar58._0_4_ = -(uint)(iVar32 < auVar63._0_4_);
          auVar58._4_4_ = -(uint)(iVar36 < auVar63._4_4_);
          auVar58._8_4_ = -(uint)(iVar38 < auVar63._8_4_);
          auVar58._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
          auVar75._4_4_ = auVar58._0_4_;
          auVar75._0_4_ = auVar58._0_4_;
          auVar75._8_4_ = auVar58._8_4_;
          auVar75._12_4_ = auVar58._8_4_;
          iVar79 = -(uint)(auVar63._4_4_ == iVar36);
          iVar83 = -(uint)(auVar63._12_4_ == iVar65);
          auVar21._4_4_ = iVar79;
          auVar21._0_4_ = iVar79;
          auVar21._8_4_ = iVar83;
          auVar21._12_4_ = iVar83;
          auVar82._4_4_ = auVar58._4_4_;
          auVar82._0_4_ = auVar58._4_4_;
          auVar82._8_4_ = auVar58._12_4_;
          auVar82._12_4_ = auVar58._12_4_;
          auVar63 = auVar21 & auVar75 | auVar82;
          auVar63 = packssdw(auVar63,auVar63);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar63 = packssdw(auVar63 ^ auVar9,auVar63 ^ auVar9);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            ppVar40[uVar39 + (uVar37 - 5)] = pVar3;
          }
          auVar63 = pshufhw(auVar63,auVar75,0x84);
          auVar22._4_4_ = iVar79;
          auVar22._0_4_ = iVar79;
          auVar22._8_4_ = iVar83;
          auVar22._12_4_ = iVar83;
          auVar66 = pshufhw(auVar58,auVar22,0x84);
          auVar43 = pshufhw(auVar63,auVar82,0x84);
          auVar48._8_4_ = 0xffffffff;
          auVar48._0_8_ = 0xffffffffffffffff;
          auVar48._12_4_ = 0xffffffff;
          auVar48 = (auVar43 | auVar66 & auVar63) ^ auVar48;
          auVar63 = packssdw(auVar48,auVar48);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63._10_2_ >> 8 & 1) != 0) {
            ppVar40[uVar39 + (uVar37 - 4)] = pVar3;
          }
          auVar63 = (auVar61 | _DAT_00183b10) ^ auVar29;
          auVar59._0_4_ = -(uint)(iVar32 < auVar63._0_4_);
          auVar59._4_4_ = -(uint)(iVar36 < auVar63._4_4_);
          auVar59._8_4_ = -(uint)(iVar38 < auVar63._8_4_);
          auVar59._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
          auVar23._4_4_ = auVar59._0_4_;
          auVar23._0_4_ = auVar59._0_4_;
          auVar23._8_4_ = auVar59._8_4_;
          auVar23._12_4_ = auVar59._8_4_;
          auVar66 = pshuflw(auVar82,auVar23,0xe8);
          auVar49._0_4_ = -(uint)(auVar63._0_4_ == iVar32);
          auVar49._4_4_ = -(uint)(auVar63._4_4_ == iVar36);
          auVar49._8_4_ = -(uint)(auVar63._8_4_ == iVar38);
          auVar49._12_4_ = -(uint)(auVar63._12_4_ == iVar65);
          auVar76._4_4_ = auVar49._4_4_;
          auVar76._0_4_ = auVar49._4_4_;
          auVar76._8_4_ = auVar49._12_4_;
          auVar76._12_4_ = auVar49._12_4_;
          auVar63 = pshuflw(auVar49,auVar76,0xe8);
          auVar77._4_4_ = auVar59._4_4_;
          auVar77._0_4_ = auVar59._4_4_;
          auVar77._8_4_ = auVar59._12_4_;
          auVar77._12_4_ = auVar59._12_4_;
          auVar43 = pshuflw(auVar59,auVar77,0xe8);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar63 = packssdw(auVar63 & auVar66,(auVar43 | auVar63 & auVar66) ^ auVar10);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            ppVar40[uVar39 + (uVar37 - 3)] = pVar3;
          }
          auVar24._4_4_ = auVar59._0_4_;
          auVar24._0_4_ = auVar59._0_4_;
          auVar24._8_4_ = auVar59._8_4_;
          auVar24._12_4_ = auVar59._8_4_;
          auVar77 = auVar76 & auVar24 | auVar77;
          auVar43 = packssdw(auVar77,auVar77);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar63 = packssdw(auVar63,auVar43 ^ auVar11);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63._12_2_ >> 8 & 1) != 0) {
            ppVar40[uVar39 + (uVar37 - 2)] = pVar3;
          }
          auVar63 = (auVar61 | _DAT_00183b00) ^ auVar29;
          auVar50._0_4_ = -(uint)(iVar32 < auVar63._0_4_);
          auVar50._4_4_ = -(uint)(iVar36 < auVar63._4_4_);
          auVar50._8_4_ = -(uint)(iVar38 < auVar63._8_4_);
          auVar50._12_4_ = -(uint)(iVar65 < auVar63._12_4_);
          auVar78._4_4_ = auVar50._0_4_;
          auVar78._0_4_ = auVar50._0_4_;
          auVar78._8_4_ = auVar50._8_4_;
          auVar78._12_4_ = auVar50._8_4_;
          auVar62._4_4_ = -(uint)(auVar63._4_4_ == iVar36);
          auVar62._12_4_ = -(uint)(auVar63._12_4_ == iVar65);
          auVar62._0_4_ = auVar62._4_4_;
          auVar62._8_4_ = auVar62._12_4_;
          auVar64._4_4_ = auVar50._4_4_;
          auVar64._0_4_ = auVar50._4_4_;
          auVar64._8_4_ = auVar50._12_4_;
          auVar64._12_4_ = auVar50._12_4_;
          auVar43 = auVar62 & auVar78 | auVar64;
          auVar63 = packssdw(auVar50,auVar43);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar63 = packssdw(auVar63 ^ auVar12,auVar63 ^ auVar12);
          auVar63 = packsswb(auVar63,auVar63);
          if ((auVar63 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            ppVar40[uVar39 + (uVar37 - 1)] = pVar3;
          }
          auVar63 = pshufhw(auVar63,auVar78,0x84);
          auVar43 = pshufhw(auVar43,auVar62,0x84);
          in_XMM1 = auVar43 & auVar63;
          auVar63 = pshufhw(auVar63,auVar64,0x84);
          auVar51._8_4_ = 0xffffffff;
          auVar51._0_8_ = 0xffffffffffffffff;
          auVar51._12_4_ = 0xffffffff;
          auVar51 = (auVar63 | in_XMM1) ^ auVar51;
          auVar63 = packssdw(auVar51,auVar51);
          in_XMM0 = packsswb(auVar63,auVar63);
          if ((in_XMM0._14_2_ >> 8 & 1) != 0) {
            ppVar40[uVar39 + uVar37] = pVar3;
          }
          uVar39 = uVar39 + 0x10;
        } while ((((uint)width - uVar37) + 0xf & 0xfffffffffffffff0) != uVar39);
      }
      dst = dst + i_dst;
      ppVar40 = ppVar40 + i_dst;
    } while (iVar41 != height);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_X(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    int i, j;
    int offset;
    int width2 = width << 1;

    for (j = 0; j < height; j++) {
        int c1, c2, c3, c4;
        int idx = getContextPixel(mode, 0, j + 1, &offset);
        int pred_width = COM_MIN(width, width2 - idx + 1);

        c1 = 32 - offset;
        c2 = 64 - offset;
        c3 = 32 + offset;
        c4 = offset;

        for (i = 0; i < pred_width; i++, idx++) {
            dst[i] = (src[idx] * c1 + src[idx + 1] * c2 + src[idx + 2] * c3 + src[idx + 3] * c4 + 64) >> 7;
        }
        if (pred_width <= 0) {
            dst[0] = (src[width2] * c1 + src[width2 + 1] * c2 + src[width2 + 2] * c3 + src[width2 + 3] * c4 + 64) >> 7;
            pred_width = 1;
        }
        for (; i < width; i++) {
            dst[i] = dst[pred_width - 1];
        }
        dst += i_dst;
    }
}